

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
* deqp::gls::BuiltinPrecisionTests::createES3BuiltinCases(void)

{
  deInt32 *pdVar1;
  BuiltinFuncs *funcs;
  CaseFactory *pCVar2;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  *in_RDI;
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  *this;
  CaseFactory *local_638;
  SharedPtrStateBase *local_630;
  value_type local_628;
  value_type local_618;
  value_type local_608;
  value_type local_5f8;
  value_type local_5e8;
  value_type local_5d8;
  value_type local_5c8;
  value_type local_5b8;
  value_type local_5a8;
  value_type local_598;
  value_type local_588;
  value_type local_578;
  value_type local_568;
  value_type local_558;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  funcs = (BuiltinFuncs *)operator_new(0x20);
  (funcs->super_CaseFactories)._vptr_CaseFactories = (_func_int **)0x0;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (funcs->super_CaseFactories)._vptr_CaseFactories = (_func_int **)&PTR__BuiltinFuncs_021b98d8;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Add>(funcs,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sub>(funcs,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mul>(funcs,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Div>(funcs,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Radians>(funcs,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Degrees>(funcs,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sin>(funcs,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cos>(funcs,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Tan>(funcs,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ASin>(funcs,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ACos>(funcs,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"atan2","");
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATan2>(funcs,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATan>(funcs,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sinh>(funcs,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cosh>(funcs,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Tanh>(funcs,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ASinh>(funcs,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ACosh>(funcs,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATanh>(funcs,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Pow>(funcs,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Exp>(funcs,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Log>(funcs,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>(funcs,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Log2>(funcs,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sqrt>(funcs,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::InverseSqrt>(funcs,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Abs>(funcs,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sign>(funcs,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Floor>(funcs,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Trunc>(funcs,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Round>(funcs,&local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::RoundEven>(funcs,&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Ceil>(funcs,&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Fract>(funcs,&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mod>(funcs,&local_488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  createSimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Modf>();
  this = &funcs->m_factories;
  local_558.m_ptr = local_638;
  local_558.m_state = local_630;
  if (local_630 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_630->strongRefCount = local_630->strongRefCount + 1;
    UNLOCK();
    LOCK();
    local_630->weakRefCount = local_630->weakRefCount + 1;
    UNLOCK();
  }
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_558);
  if (local_558.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_558.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_558.m_ptr = (CaseFactory *)0x0;
      (*(local_558.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_558.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_558.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_558.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_558.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_630 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_630->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_638 = (CaseFactory *)0x0;
      (*local_630->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_630->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_630 != (SharedPtrStateBase *)0x0) {
        (*local_630->_vptr_SharedPtrStateBase[1])();
      }
      local_630 = (SharedPtrStateBase *)0x0;
    }
  }
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Min>(funcs,&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Max>(funcs,&local_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Clamp>(funcs,&local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mix>(funcs,&local_508);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Step>(funcs,&local_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,0x1b3c1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::SmoothStep>(funcs,&local_548);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021b9928;
  local_578.m_state = (SharedPtrStateBase *)0x0;
  local_578.m_ptr = pCVar2;
  local_578.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_578.m_state)->strongRefCount = 0;
  (local_578.m_state)->weakRefCount = 0;
  (local_578.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_578.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_578.m_state)->strongRefCount = 1;
  (local_578.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_578);
  if (local_578.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_578.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_578.m_ptr = (CaseFactory *)0x0;
      (*(local_578.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_578.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_578.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_578.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_578.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021bb178;
  local_588.m_state = (SharedPtrStateBase *)0x0;
  local_588.m_ptr = pCVar2;
  local_588.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_588.m_state)->strongRefCount = 0;
  (local_588.m_state)->weakRefCount = 0;
  (local_588.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_588.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_588.m_state)->strongRefCount = 1;
  (local_588.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_588);
  if (local_588.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_588.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_588.m_ptr = (CaseFactory *)0x0;
      (*(local_588.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_588.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_588.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_588.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_588.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021bbf58;
  local_598.m_state = (SharedPtrStateBase *)0x0;
  local_598.m_ptr = pCVar2;
  local_598.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_598.m_state)->strongRefCount = 0;
  (local_598.m_state)->weakRefCount = 0;
  (local_598.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_598.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_598.m_state)->strongRefCount = 1;
  (local_598.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_598);
  if (local_598.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_598.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_598.m_ptr = (CaseFactory *)0x0;
      (*(local_598.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_598.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_598.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_598.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_598.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  createSimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cross>();
  local_568.m_ptr = local_638;
  local_568.m_state = local_630;
  if (local_630 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_630->strongRefCount = local_630->strongRefCount + 1;
    UNLOCK();
    LOCK();
    local_630->weakRefCount = local_630->weakRefCount + 1;
    UNLOCK();
  }
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_568);
  if (local_568.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_568.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_568.m_ptr = (CaseFactory *)0x0;
      (*(local_568.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_568.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_568.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_568.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_568.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_630 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_630->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*local_630->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_630->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_630 != (SharedPtrStateBase *)0x0)) {
      (*local_630->_vptr_SharedPtrStateBase[1])();
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021bc038;
  local_5a8.m_state = (SharedPtrStateBase *)0x0;
  local_5a8.m_ptr = pCVar2;
  local_5a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_5a8.m_state)->strongRefCount = 0;
  (local_5a8.m_state)->weakRefCount = 0;
  (local_5a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_5a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_5a8.m_state)->strongRefCount = 1;
  (local_5a8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_5a8);
  if (local_5a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_5a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_5a8.m_ptr = (CaseFactory *)0x0;
      (*(local_5a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_5a8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_5a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_5a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_5a8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021bcdb0;
  local_5b8.m_state = (SharedPtrStateBase *)0x0;
  local_5b8.m_ptr = pCVar2;
  local_5b8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_5b8.m_state)->strongRefCount = 0;
  (local_5b8.m_state)->weakRefCount = 0;
  (local_5b8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_5b8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_5b8.m_state)->strongRefCount = 1;
  (local_5b8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_5b8);
  if (local_5b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_5b8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_5b8.m_ptr = (CaseFactory *)0x0;
      (*(local_5b8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_5b8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_5b8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_5b8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_5b8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021be220;
  local_5c8.m_state = (SharedPtrStateBase *)0x0;
  local_5c8.m_ptr = pCVar2;
  local_5c8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_5c8.m_state)->strongRefCount = 0;
  (local_5c8.m_state)->weakRefCount = 0;
  (local_5c8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_5c8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_5c8.m_state)->strongRefCount = 1;
  (local_5c8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_5c8);
  if (local_5c8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_5c8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_5c8.m_ptr = (CaseFactory *)0x0;
      (*(local_5c8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_5c8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_5c8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_5c8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_5c8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021beda8;
  local_5d8.m_state = (SharedPtrStateBase *)0x0;
  local_5d8.m_ptr = pCVar2;
  local_5d8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_5d8.m_state)->strongRefCount = 0;
  (local_5d8.m_state)->weakRefCount = 0;
  (local_5d8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_5d8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_5d8.m_state)->strongRefCount = 1;
  (local_5d8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_5d8);
  if (local_5d8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_5d8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_5d8.m_ptr = (CaseFactory *)0x0;
      (*(local_5d8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_5d8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_5d8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_5d8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_5d8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021bf620;
  local_5e8.m_state = (SharedPtrStateBase *)0x0;
  local_5e8.m_ptr = pCVar2;
  local_5e8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_5e8.m_state)->strongRefCount = 0;
  (local_5e8.m_state)->weakRefCount = 0;
  (local_5e8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_5e8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_5e8.m_state)->strongRefCount = 1;
  (local_5e8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_5e8);
  if (local_5e8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_5e8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_5e8.m_ptr = (CaseFactory *)0x0;
      (*(local_5e8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_5e8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_5e8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_5e8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_5e8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021c1a98;
  local_5f8.m_state = (SharedPtrStateBase *)0x0;
  local_5f8.m_ptr = pCVar2;
  local_5f8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_5f8.m_state)->strongRefCount = 0;
  (local_5f8.m_state)->weakRefCount = 0;
  (local_5f8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_5f8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_5f8.m_state)->strongRefCount = 1;
  (local_5f8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_5f8);
  if (local_5f8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_5f8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_5f8.m_ptr = (CaseFactory *)0x0;
      (*(local_5f8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_5f8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_5f8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_5f8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_5f8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021c2d80;
  local_608.m_state = (SharedPtrStateBase *)0x0;
  local_608.m_ptr = pCVar2;
  local_608.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_608.m_state)->strongRefCount = 0;
  (local_608.m_state)->weakRefCount = 0;
  (local_608.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_608.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_608.m_state)->strongRefCount = 1;
  (local_608.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_608);
  if (local_608.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_608.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_608.m_ptr = (CaseFactory *)0x0;
      (*(local_608.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_608.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_608.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_608.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_608.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021c4068;
  local_618.m_state = (SharedPtrStateBase *)0x0;
  local_618.m_ptr = pCVar2;
  local_618.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_618.m_state)->strongRefCount = 0;
  (local_618.m_state)->weakRefCount = 0;
  (local_618.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_618.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_618.m_state)->strongRefCount = 1;
  (local_618.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_618);
  if (local_618.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_618.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_618.m_ptr = (CaseFactory *)0x0;
      (*(local_618.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_618.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_618.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_618.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_618.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_021c4460;
  local_628.m_state = (SharedPtrStateBase *)0x0;
  local_628.m_ptr = pCVar2;
  local_628.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_628.m_state)->strongRefCount = 0;
  (local_628.m_state)->weakRefCount = 0;
  (local_628.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021ca6b8;
  local_628.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar2;
  (local_628.m_state)->strongRefCount = 1;
  (local_628.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(this,&local_628);
  if (local_628.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_628.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_628.m_ptr = (CaseFactory *)0x0;
      (*(local_628.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_628.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_628.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_628.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  (in_RDI->
  super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ).m_data.ptr = (CaseFactories *)funcs;
  return in_RDI;
}

Assistant:

MovePtr<const CaseFactories> createES3BuiltinCases (void)
{
	MovePtr<BuiltinFuncs>	funcs	(new BuiltinFuncs());

	addScalarFactory<Add>(*funcs);
	addScalarFactory<Sub>(*funcs);
	addScalarFactory<Mul>(*funcs);
	addScalarFactory<Div>(*funcs);

	addScalarFactory<Radians>(*funcs);
	addScalarFactory<Degrees>(*funcs);
	addScalarFactory<Sin>(*funcs);
	addScalarFactory<Cos>(*funcs);
	addScalarFactory<Tan>(*funcs);
	addScalarFactory<ASin>(*funcs);
	addScalarFactory<ACos>(*funcs);
	addScalarFactory<ATan2>(*funcs, "atan2");
	addScalarFactory<ATan>(*funcs);
	addScalarFactory<Sinh>(*funcs);
	addScalarFactory<Cosh>(*funcs);
	addScalarFactory<Tanh>(*funcs);
	addScalarFactory<ASinh>(*funcs);
	addScalarFactory<ACosh>(*funcs);
	addScalarFactory<ATanh>(*funcs);

	addScalarFactory<Pow>(*funcs);
	addScalarFactory<Exp>(*funcs);
	addScalarFactory<Log>(*funcs);
	addScalarFactory<Exp2>(*funcs);
	addScalarFactory<Log2>(*funcs);
	addScalarFactory<Sqrt>(*funcs);
	addScalarFactory<InverseSqrt>(*funcs);

	addScalarFactory<Abs>(*funcs);
	addScalarFactory<Sign>(*funcs);
	addScalarFactory<Floor>(*funcs);
	addScalarFactory<Trunc>(*funcs);
	addScalarFactory<Round>(*funcs);
	addScalarFactory<RoundEven>(*funcs);
	addScalarFactory<Ceil>(*funcs);
	addScalarFactory<Fract>(*funcs);
	addScalarFactory<Mod>(*funcs);
	funcs->addFactory(createSimpleFuncCaseFactory<Modf>());
	addScalarFactory<Min>(*funcs);
	addScalarFactory<Max>(*funcs);
	addScalarFactory<Clamp>(*funcs);
	addScalarFactory<Mix>(*funcs);
	addScalarFactory<Step>(*funcs);
	addScalarFactory<SmoothStep>(*funcs);

	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Length>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Distance>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Dot>()));
	funcs->addFactory(createSimpleFuncCaseFactory<Cross>());
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Normalize>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<FaceForward>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Reflect>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Refract>()));


	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<MatrixCompMult>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<OuterProduct>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<Transpose>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new SquareMatrixFuncCaseFactory<Determinant>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new SquareMatrixFuncCaseFactory<Inverse>()));

	return MovePtr<const CaseFactories>(funcs.release());
}